

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_init_certinfo(Curl_easy *data,int num)

{
  CURLcode CVar1;
  curl_slist **ppcVar2;
  
  Curl_ssl_free_certinfo(data);
  ppcVar2 = (curl_slist **)(*Curl_ccalloc)((long)num,8);
  if (ppcVar2 == (curl_slist **)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    (data->info).certs.num_of_certs = num;
    (data->info).certs.certinfo = ppcVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ssl_init_certinfo(struct Curl_easy *data, int num)
{
  struct curl_certinfo *ci = &data->info.certs;
  struct curl_slist **table;

  /* Free any previous certificate information structures */
  Curl_ssl_free_certinfo(data);

  /* Allocate the required certificate information structures */
  table = calloc((size_t) num, sizeof(struct curl_slist *));
  if(!table)
    return CURLE_OUT_OF_MEMORY;

  ci->num_of_certs = num;
  ci->certinfo = table;

  return CURLE_OK;
}